

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void gd_stderr_error(int priority,char *format,__va_list_tag *args)

{
  __va_list_tag *args_local;
  char *format_local;
  int priority_local;
  
  switch(priority) {
  case 3:
    fputs("GD Error: ",_stderr);
    break;
  case 4:
    fputs("GD Warning: ",_stderr);
    break;
  case 5:
    fputs("GD Notice: ",_stderr);
    break;
  case 6:
    fputs("GD Info: ",_stderr);
    break;
  case 7:
    fputs("GD Debug: ",_stderr);
  }
  vfprintf(_stderr,format,args);
  fflush(_stderr);
  return;
}

Assistant:

void gd_stderr_error(int priority, const char *format, va_list args)
{
	switch (priority) {
	case GD_ERROR:
		fputs("GD Error: ", stderr);
		break;
	case GD_WARNING:
		fputs("GD Warning: ", stderr);
		break;
	case GD_NOTICE:
		fputs("GD Notice: ", stderr);
		break;
	case GD_INFO:
		fputs("GD Info: ", stderr);
		break;
	case GD_DEBUG:
		fputs("GD Debug: ", stderr);
		break;
	}
	vfprintf(stderr, format, args);
	fflush(stderr);
}